

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O0

llb_build_value_file_info_t *
llbuild::capi::convertFileInfo
          (llb_build_value_file_info_t *__return_storage_ptr__,FileInfo *fileInfo)

{
  FileInfo *fileInfo_local;
  
  __return_storage_ptr__->device = fileInfo->device;
  __return_storage_ptr__->inode = fileInfo->inode;
  __return_storage_ptr__->mode = fileInfo->mode;
  __return_storage_ptr__->size = fileInfo->size;
  (__return_storage_ptr__->modTime).seconds = (fileInfo->modTime).seconds;
  (__return_storage_ptr__->modTime).nanoseconds = (fileInfo->modTime).nanoseconds;
  return __return_storage_ptr__;
}

Assistant:

const llb_build_value_file_info_t llbuild::capi::convertFileInfo(const basic::FileInfo &fileInfo) {
  return llb_build_value_file_info_t {
    fileInfo.device,
    fileInfo.inode,
    fileInfo.mode,
    fileInfo.size,
    llb_build_value_file_timestamp_t {
      fileInfo.modTime.seconds,
      fileInfo.modTime.nanoseconds,
    },
  };
}